

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_pname;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  uVar2 = name->_M_string_length;
  if (2 < uVar2) {
    ::std::__cxx11::string::substr((ulong)&local_pname,(ulong)name);
    bVar1 = ::std::operator==(&local_pname,"--");
    ::std::__cxx11::string::~string((string *)&local_pname);
    if (bVar1) {
      ::std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
      bVar1 = check_lname(this,&local_40);
      __rhs = &local_40;
      goto LAB_00110ed5;
    }
    uVar2 = name->_M_string_length;
  }
  if (1 < uVar2) {
    ::std::__cxx11::string::substr((ulong)&local_pname,(ulong)name);
    bVar1 = ::std::operator==(&local_pname,"-");
    ::std::__cxx11::string::~string((string *)&local_pname);
    if (bVar1) {
      ::std::__cxx11::string::substr((ulong)&local_60,(ulong)name);
      bVar1 = check_sname(this,&local_60);
      __rhs = &local_60;
      goto LAB_00110ed5;
    }
  }
  ::std::__cxx11::string::string((string *)&local_pname,(string *)&this->pname_);
  if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
    ::std::__cxx11::string::string((string *)&local_a0,(string *)&local_pname);
    detail::to_lower(&local_80,&local_a0);
    ::std::__cxx11::string::operator=((string *)&local_pname,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::string((string *)&local_c0,(string *)name);
    detail::to_lower(&local_80,&local_c0);
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_c0);
  }
  __rhs = &local_pname;
  bVar1 = ::std::operator==(name,__rhs);
LAB_00110ed5:
  ::std::__cxx11::string::~string((string *)__rhs);
  return bVar1;
}

Assistant:

bool check_name(std::string name) const {

        if(name.length() > 2 && name.substr(0, 2) == "--")
            return check_lname(name.substr(2));
        else if(name.length() > 1 && name.substr(0, 1) == "-")
            return check_sname(name.substr(1));
        else {
            std::string local_pname = pname_;
            if(ignore_case_) {
                local_pname = detail::to_lower(local_pname);
                name = detail::to_lower(name);
            }
            return name == local_pname;
        }
    }